

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall QtMWidgets::MsgBoxTitle::paintEvent(MsgBoxTitle *this,QPaintEvent *param_1)

{
  MsgBoxTitlePrivate *pMVar1;
  QPalette *this_00;
  QRect QVar2;
  QPainter p;
  undefined1 auStack_68 [32];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  QRect local_28;
  QMargins local_18;
  
  QPainter::QPainter((QPainter *)auStack_68,(QPaintDevice *)&this->field_0x10);
  this_00 = (QPalette *)QWidget::palette();
  QPalette::color(this_00,WindowText);
  QPainter::setPen((QColor *)auStack_68);
  local_28 = QWidget::rect(&this->super_QWidget);
  local_18.m_left = ((this->d).d)->margin;
  local_18.m_top = 0;
  local_18.m_bottom = 0;
  local_18.m_right = local_18.m_left;
  QVar2 = QRect::marginsRemoved(&local_28,&local_18);
  local_48 = (double)QVar2.x1;
  local_40 = (double)QVar2.y1;
  local_38 = (double)((QVar2.x2 - QVar2.x1) + 1);
  local_30 = (double)((QVar2.y2 - QVar2.y1) + 1);
  pMVar1 = (this->d).d;
  QTextOption::QTextOption((QTextOption *)(auStack_68 + 8),0x81);
  QPainter::drawText((QRectF *)auStack_68,(QString *)&local_48,(QTextOption *)&pMVar1->preparedTitle
                    );
  QTextOption::~QTextOption((QTextOption *)(auStack_68 + 8));
  QPainter::~QPainter((QPainter *)auStack_68);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::WindowText ) );

		p.drawText( rect().marginsRemoved( QMargins( d->margin, 0,
				d->margin, 0 ) ),
			d->preparedTitle, QTextOption( Qt::AlignLeft | Qt::AlignVCenter ) );
	}